

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O3

pcp_flow_event_e fhndl_resend(pcp_flow_t *f,pcp_recv_msg_t *msg)

{
  __suseconds_t *p_Var1;
  pcp_errno pVar2;
  uint uVar3;
  pcp_server_t *s;
  uint uVar4;
  pcp_flow_event_e pVar5;
  
  s = get_pcp_server(f->ctx,f->pcp_server_indx);
  pVar5 = fev_failed;
  if ((s != (pcp_server_t *)0x0) && (uVar4 = f->retry_count + 1, f->retry_count = uVar4, uVar4 < 3))
  {
    pVar2 = pcp_flow_send_msg(f,s);
    if (pVar2 == PCP_ERR_SUCCESS) {
      f->resend_timeout = f->resend_timeout << 1;
      uVar3 = rand();
      uVar4 = 3000;
      if (3000 < f->resend_timeout) {
        uVar4 = f->resend_timeout;
      }
      if (0xf9fff < uVar4) {
        uVar4 = 0xfa000;
      }
      f->resend_timeout = uVar4 * (0x2400 - (uVar3 & 0x7ff)) >> 0xd;
      gettimeofday((timeval *)&f->timeout,(__timezone_ptr_t)0x0);
      uVar4 = f->resend_timeout;
      (f->timeout).tv_sec = (f->timeout).tv_sec + (ulong)uVar4 / 1000;
      p_Var1 = &(f->timeout).tv_usec;
      *p_Var1 = *p_Var1 + (ulong)((uVar4 % 1000) * 1000);
      pVar5 = fev_msg_sent;
    }
  }
  return pVar5;
}

Assistant:

static pcp_flow_event_e fhndl_resend(pcp_flow_t *f,
                                     UNUSED pcp_recv_msg_t *msg) {
    pcp_server_t *s = get_pcp_server(f->ctx, f->pcp_server_indx);
    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (!s) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return fev_failed;
    }

#if PCP_RETX_MRC > 0
    if (++f->retry_count >= PCP_RETX_MRC) {
        return fev_failed;
    }
#endif

    if (pcp_flow_send_msg(f, s) != PCP_ERR_SUCCESS) {
        PCP_LOG_END(PCP_LOGLVL_DEBUG);
        return fev_failed;
    }

    f->resend_timeout = PCP_RT(f->resend_timeout);

#if (PCP_RETX_MRD > 0)
    {
        int tdiff = (curtime - f->created_time) * 1000;
        if (tdiff > PCP_RETX_MRD) {
            return fev_failed;
        }
        if (tdiff > f->resend_timeout) {
            f->resend_timeout = tdiff;
        }
    }
#endif

    // set timeout field
    gettimeofday(&f->timeout, NULL);
    f->timeout.tv_sec += f->resend_timeout / 1000;
    f->timeout.tv_usec += (f->resend_timeout % 1000) * 1000;

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return fev_msg_sent;
}